

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<double>::GrowNoAnnotate
          (RepeatedField<double> *this,bool was_soo,int old_size,int new_size)

{
  byte bVar1;
  int iVar2;
  int v2;
  LogMessage *pLVar3;
  unsigned_long uVar4;
  unsigned_long *puVar5;
  void *pvVar6;
  double *__src;
  undefined1 auVar7 [16];
  double *pold;
  double *pnew;
  ulong local_118;
  unsigned_long local_110;
  size_t num_available;
  SizedPtr res;
  LogMessageFatal local_e8 [23];
  Voidify local_d1;
  unsigned_long local_d0;
  unsigned_long local_c8;
  string *local_c0;
  string *absl_log_internal_check_op_result_2;
  size_t bytes;
  undefined1 local_a0 [16];
  LogMessageFatal local_90 [23];
  Voidify local_79;
  unsigned_long local_78;
  unsigned_long local_70;
  string *local_68;
  string *absl_log_internal_check_op_result_1;
  Arena *arena;
  HeapRep *new_rep;
  undefined8 local_48;
  LogMessageFatal local_40 [23];
  Voidify local_29;
  string *local_28;
  string *absl_log_internal_check_op_result;
  int old_capacity;
  int new_size_local;
  int old_size_local;
  bool was_soo_local;
  RepeatedField<double> *this_local;
  
  absl_log_internal_check_op_result._4_4_ = new_size;
  old_capacity = old_size;
  new_size_local._3_1_ = was_soo;
  _old_size_local = this;
  absl_log_internal_check_op_result._0_4_ = Capacity(this,was_soo);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue
                    (absl_log_internal_check_op_result._4_4_);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue
                 ((int)absl_log_internal_check_op_result);
  local_28 = absl::lts_20240722::log_internal::Check_GTImpl_abi_cxx11_
                       (iVar2,v2,"new_size > old_capacity");
  if (local_28 != (string *)0x0) {
    auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
    local_48 = auVar7._8_8_;
    new_rep = auVar7._0_8_;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x4a2,new_rep,local_48);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  absl_log_internal_check_op_result_1 = (string *)GetArena(this);
  absl_log_internal_check_op_result._4_4_ =
       internal::CalculateReserveSize<double,8>
                 ((int)absl_log_internal_check_op_result,absl_log_internal_check_op_result._4_4_);
  local_70 = absl::lts_20240722::log_internal::GetReferenceableValue
                       ((long)absl_log_internal_check_op_result._4_4_);
  uVar4 = std::numeric_limits<unsigned_long>::max();
  local_78 = absl::lts_20240722::log_internal::GetReferenceableValue(uVar4 - 8 >> 3);
  local_68 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_70,&local_78,
                        "static_cast<size_t>(new_size) <= (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) / sizeof(Element)"
                       );
  if (local_68 != (string *)0x0) {
    local_a0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x4ab,local_a0._0_8_,local_a0._8_8_);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_90);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [48])"Requested size is too large to fit into size_t.");
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_79,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_90);
  }
  absl_log_internal_check_op_result_2 =
       (string *)((long)absl_log_internal_check_op_result._4_4_ * 8 + 8);
  if (absl_log_internal_check_op_result_1 == (string *)0x0) {
    local_c8 = absl::lts_20240722::log_internal::GetReferenceableValue
                         ((long)absl_log_internal_check_op_result._4_4_ & 0x1fffffffffffffff);
    iVar2 = std::numeric_limits<int>::max();
    local_d0 = absl::lts_20240722::log_internal::GetReferenceableValue((long)iVar2);
    local_c0 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                         (&local_c8,&local_d0,
                          "(bytes - kHeapRepHeaderSize) / sizeof(Element) <= static_cast<size_t>(std::numeric_limits<int>::max())"
                         );
    if (local_c0 != (string *)0x0) {
      auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_c0);
      res.n = auVar7._0_8_;
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
                 ,0x4b1,res.n,auVar7._8_8_);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_e8);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar3,(char (*) [59])
                                 "Requested size is too large to fit element count into int.");
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_d1,pLVar3);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_e8);
    }
    _num_available = internal::AllocateAtLeast((size_t)absl_log_internal_check_op_result_2);
    local_118 = (long)res.p - 8U >> 3;
    iVar2 = std::numeric_limits<int>::max();
    pnew = (double *)(long)iVar2;
    puVar5 = std::min<unsigned_long>(&local_118,(unsigned_long *)&pnew);
    local_110 = *puVar5;
    absl_log_internal_check_op_result._4_4_ = (int)local_110;
    arena = (Arena *)num_available;
  }
  else {
    arena = (Arena *)Arena::CreateArray<char>
                               ((Arena *)absl_log_internal_check_op_result_1,
                                (size_t)absl_log_internal_check_op_result_2);
  }
  (arena->impl_).tag_and_id_ = (uint64_t)absl_log_internal_check_op_result_1;
  if (0 < old_capacity) {
    pvVar6 = internal::HeapRep<8UL>::elements((HeapRep<8UL> *)arena);
    __src = elements(this,(bool)(new_size_local._3_1_ & 1));
    memcpy(pvVar6,__src,(long)old_capacity << 3);
  }
  if ((new_size_local._3_1_ & 1) == 0) {
    InternalDeallocate<false>(this);
  }
  bVar1 = new_size_local._3_1_;
  iVar2 = absl_log_internal_check_op_result._4_4_;
  pvVar6 = internal::HeapRep<8UL>::elements((HeapRep<8UL> *)arena);
  internal::SooRep::set_non_soo(&this->soo_rep_,(bool)(bVar1 & 1),iVar2,pvVar6);
  return;
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::GrowNoAnnotate(bool was_soo,
                                                              int old_size,
                                                              int new_size) {
  const int old_capacity = Capacity(was_soo);
  ABSL_DCHECK_GT(new_size, old_capacity);
  HeapRep* new_rep;
  Arena* arena = GetArena();

  new_size = internal::CalculateReserveSize<Element, kHeapRepHeaderSize>(
      old_capacity, new_size);

  ABSL_DCHECK_LE(static_cast<size_t>(new_size),
                 (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) /
                     sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kHeapRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    ABSL_DCHECK_LE((bytes - kHeapRepHeaderSize) / sizeof(Element),
                   static_cast<size_t>(std::numeric_limits<int>::max()))
        << "Requested size is too large to fit element count into int.";
    internal::SizedPtr res = internal::AllocateAtLeast(bytes);
    size_t num_available =
        std::min((res.n - kHeapRepHeaderSize) / sizeof(Element),
                 static_cast<size_t>(std::numeric_limits<int>::max()));
    new_size = static_cast<int>(num_available);
    new_rep = static_cast<HeapRep*>(res.p);
  } else {
    new_rep =
        reinterpret_cast<HeapRep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;

  if (old_size > 0) {
    Element* pnew = static_cast<Element*>(new_rep->elements());
    Element* pold = elements(was_soo);
    // TODO: add absl::is_trivially_relocatable<Element>
    if (std::is_trivial<Element>::value) {
      memcpy(static_cast<void*>(pnew), pold, old_size * sizeof(Element));
    } else {
      for (Element* end = pnew + old_size; pnew != end; ++pnew, ++pold) {
        ::new (static_cast<void*>(pnew)) Element(std::move(*pold));
        pold->~Element();
      }
    }
  }
  if (!was_soo) InternalDeallocate();

  soo_rep_.set_non_soo(was_soo, new_size, new_rep->elements());
}